

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieparser.cpp
# Opt level: O0

void __thiscall LottieParserImpl::SkipOut(LottieParserImpl *this,int depth)

{
  int in_ESI;
  LottieParserImpl *in_RDI;
  int local_c;
  LottieParserImpl *this_00;
  
  local_c = in_ESI;
  this_00 = in_RDI;
  do {
    if (((in_RDI->super_LookaheadParserHandler).st_ == kEnteringArray) ||
       ((in_RDI->super_LookaheadParserHandler).st_ == kEnteringObject)) {
      local_c = local_c + 1;
    }
    else if (((in_RDI->super_LookaheadParserHandler).st_ == kExitingArray) ||
            ((in_RDI->super_LookaheadParserHandler).st_ == kExitingObject)) {
      local_c = local_c + -1;
    }
    else if ((in_RDI->super_LookaheadParserHandler).st_ == kError) {
      return;
    }
    ParseNext(this_00);
  } while (0 < local_c);
  return;
}

Assistant:

void LottieParserImpl::SkipOut(int depth)
{
    do {
        if (st_ == kEnteringArray || st_ == kEnteringObject) {
            ++depth;
        } else if (st_ == kExitingArray || st_ == kExitingObject) {
            --depth;
        } else if (st_ == kError) {
            return;
        }

        ParseNext();
    } while (depth > 0);
}